

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_read_pcm_frames
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  bool bVar1;
  int iVar2;
  ma_result mVar3;
  ma_result mVar4;
  code *pcVar5;
  uint uVar6;
  ulong uVar7;
  long *pDataSource_00;
  long lVar8;
  ma_data_source *pDataSource_01;
  ma_data_source_base *pDataSourceBase;
  ma_uint64 mVar9;
  ma_format format;
  ma_uint32 channels;
  ma_uint32 sampleRate;
  int local_5c;
  undefined8 local_58;
  ulong local_50;
  ulong local_48;
  int local_3c;
  int local_38;
  undefined1 local_34 [4];
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  mVar4 = MA_INVALID_ARGS;
  if (pDataSource != (ma_data_source *)0x0 && frameCount != 0) {
    local_3c = *(int *)((long)pDataSource + 0x40);
    if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
      local_48 = 0;
      local_5c = 0;
      bVar1 = false;
    }
    else {
      local_48 = 0;
      iVar2 = (**(code **)(*pDataSource + 0x10))(pDataSource,&local_58,&local_38,local_34,0,0);
      local_5c = 0;
      bVar1 = false;
      if (iVar2 == 0) {
        local_48 = (ulong)(uint)local_58;
        local_5c = local_38;
        bVar1 = true;
      }
    }
    if (bVar1) {
      if (frameCount == 0) {
        mVar9 = 0;
        mVar3 = MA_SUCCESS;
      }
      else {
        local_50 = 0;
        mVar9 = 0;
        do {
          pDataSource_00 = *(long **)((long)pDataSource + 0x28);
          if (*(long **)((long)pDataSource + 0x28) == (long *)0x0) {
            if (*(long *)((long)pDataSource + 0x30) == 0) {
              pDataSource_00 = (long *)0x0;
              if (*(long *)((long)pDataSource + 0x38) == 0) {
                pDataSource_00 = (long *)pDataSource;
              }
            }
            else {
              pDataSource_00 = (long *)0x0;
            }
          }
          if (pDataSource_00 == (long *)0x0) goto LAB_001465bb;
          mVar3 = ma_data_source_read_pcm_frames_within_range
                            (pDataSource_00,pFramesOut,frameCount - mVar9,&local_58);
          mVar9 = mVar9 + CONCAT44(local_58._4_4_,(uint)local_58);
          mVar4 = mVar3;
          if (mVar3 == MA_SUCCESS) {
LAB_001465d5:
            mVar3 = mVar4;
            bVar1 = true;
            if (pFramesOut == (void *)0x0) {
              pFramesOut = (void *)0x0;
            }
            else {
              pFramesOut = (void *)((long)pFramesOut +
                                   (ulong)(uint)((&DAT_0017d490)[local_48] * local_5c) *
                                   CONCAT44(local_58._4_4_,(uint)local_58));
            }
          }
          else if (mVar3 == MA_AT_END) {
            if (local_3c == 0) {
              if (pDataSource_00[6] == 0) {
                if ((code *)pDataSource_00[7] != (code *)0x0) {
                  lVar8 = (*(code *)pDataSource_00[7])(pDataSource_00);
                  *(long *)((long)pDataSource + 0x28) = lVar8;
                  if (lVar8 != 0) goto LAB_0014657c;
                }
LAB_001465bb:
                mVar3 = MA_SUCCESS;
                goto LAB_001465bd;
              }
              *(long *)((long)pDataSource + 0x28) = pDataSource_00[6];
LAB_0014657c:
              pDataSource_00 = *(long **)((long)pDataSource + 0x28);
              if (pDataSource_00 != (long *)0x0) {
                pcVar5 = *(code **)(*pDataSource_00 + 8);
                if (pcVar5 != (code *)0x0) {
                  lVar8 = pDataSource_00[1];
                  goto LAB_00146596;
                }
                goto LAB_0014659c;
              }
              mVar3 = MA_INVALID_ARGS;
            }
            else {
              uVar7 = 0;
              if (CONCAT44(local_58._4_4_,(uint)local_58) == 0) {
                uVar6 = (int)local_50 + 1;
                local_50 = (ulong)uVar6;
                mVar3 = MA_SUCCESS;
                uVar7 = (ulong)uVar6;
                if (1 < uVar6) goto LAB_001465bd;
              }
              pcVar5 = *(code **)(*pDataSource_00 + 8);
              local_50 = uVar7;
              if (pcVar5 == (code *)0x0) {
LAB_0014659c:
                mVar3 = MA_NOT_IMPLEMENTED;
              }
              else {
                mVar3 = MA_INVALID_OPERATION;
                if ((ulong)pDataSource_00[3] <= (ulong)pDataSource_00[2]) {
                  lVar8 = pDataSource_00[3] + pDataSource_00[1];
LAB_00146596:
                  mVar3 = (*pcVar5)(pDataSource_00,lVar8);
                }
              }
            }
            bVar1 = false;
            mVar4 = MA_SUCCESS;
            if (mVar3 == MA_SUCCESS) goto LAB_001465d5;
          }
          else {
LAB_001465bd:
            bVar1 = false;
          }
        } while ((bVar1) && (mVar9 < frameCount));
      }
      if (pFramesRead != (ma_uint64 *)0x0) {
        *pFramesRead = mVar9;
      }
      mVar4 = MA_AT_END;
      if (mVar9 != 0) {
        mVar4 = mVar3;
      }
      if (mVar3 != MA_SUCCESS) {
        mVar4 = mVar3;
      }
    }
    else {
      pDataSource_01 = *(ma_data_source **)((long)pDataSource + 0x28);
      if (*(ma_data_source **)((long)pDataSource + 0x28) == (ma_data_source *)0x0) {
        if (*(long *)((long)pDataSource + 0x30) == 0) {
          pDataSource_01 = (ma_data_source *)0x0;
          if (*(long *)((long)pDataSource + 0x38) == 0) {
            pDataSource_01 = pDataSource;
          }
        }
        else {
          pDataSource_01 = (ma_data_source *)0x0;
        }
      }
      mVar4 = ma_data_source_read_pcm_frames_within_range
                        (pDataSource_01,pFramesOut,frameCount,pFramesRead);
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_data_source_read_pcm_frames(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_data_source_base* pCurrentDataSource;
    void* pRunningFramesOut = pFramesOut;
    ma_uint64 totalFramesProcessed = 0;
    ma_format format;
    ma_uint32 channels;
    ma_uint32 emptyLoopCounter = 0; /* Keeps track of how many times 0 frames have been read. For infinite loop detection of sounds with no audio data. */
    ma_bool32 loop;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    loop = ma_data_source_is_looping(pDataSource);

    /*
    We need to know the data format so we can advance the output buffer as we read frames. If this
    fails, chaining will not work and we'll just read as much as we can from the current source.
    */
    if (ma_data_source_get_data_format(pDataSource, &format, &channels, NULL, NULL, 0) != MA_SUCCESS) {
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            return result;
        }

        return ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pFramesOut, frameCount, pFramesRead);
    }

    /*
    Looping is a bit of a special case. When the `loop` argument is true, chaining will not work and
    only the current data source will be read from.
    */

    /* Keep reading until we've read as many frames as possible. */
    while (totalFramesProcessed < frameCount) {
        ma_uint64 framesProcessed;
        ma_uint64 framesRemaining = frameCount - totalFramesProcessed;

        /* We need to resolve the data source that we'll actually be reading from. */
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            break;
        }

        if (pCurrentDataSource == NULL) {
            break;
        }

        result = ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pRunningFramesOut, framesRemaining, &framesProcessed);
        totalFramesProcessed += framesProcessed;

        /*
        If we encountered an error from the read callback, make sure it's propagated to the caller. The caller may need to know whether or not MA_BUSY is returned which is
        not necessarily considered an error.
        */
        if (result != MA_SUCCESS && result != MA_AT_END) {
            break;
        }

        /*
        We can determine if we've reached the end by checking if ma_data_source_read_pcm_frames_within_range() returned
        MA_AT_END. To loop back to the start, all we need to do is seek back to the first frame.
        */
        if (result == MA_AT_END) {
            /*
            The result needs to be reset back to MA_SUCCESS (from MA_AT_END) so that we don't
            accidentally return MA_AT_END when data has been read in prior loop iterations. at the
            end of this function, the result will be checked for MA_SUCCESS, and if the total
            number of frames processed is 0, will be explicitly set to MA_AT_END.
            */
            result = MA_SUCCESS;

            /*
            We reached the end. If we're looping, we just loop back to the start of the current
            data source. If we're not looping we need to check if we have another in the chain, and
            if so, switch to it.
            */
            if (loop) {
                if (framesProcessed == 0) {
                    emptyLoopCounter += 1;
                    if (emptyLoopCounter > 1) {
                        break;  /* Infinite loop detected. Get out. */
                    }
                } else {
                    emptyLoopCounter = 0;
                }

                result = ma_data_source_seek_to_pcm_frame(pCurrentDataSource, pCurrentDataSource->loopBegInFrames);
                if (result != MA_SUCCESS) {
                    break;  /* Failed to loop. Abort. */
                }

                /* Don't return MA_AT_END for looping sounds. */
                result = MA_SUCCESS;
            } else {
                if (pCurrentDataSource->pNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->pNext;
                } else if (pCurrentDataSource->onGetNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->onGetNext(pCurrentDataSource);
                    if (pDataSourceBase->pCurrent == NULL) {
                        break;  /* Our callback did not return a next data source. We're done. */
                    }
                } else {
                    /* Reached the end of the chain. We're done. */
                    break;
                }

                /* The next data source needs to be rewound to ensure data is read in looping scenarios. */
                result = ma_data_source_seek_to_pcm_frame(pDataSourceBase->pCurrent, 0);
                if (result != MA_SUCCESS) {
                    break;
                }
            }
        }

        if (pRunningFramesOut != NULL) {
            pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesProcessed * ma_get_bytes_per_frame(format, channels));
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesProcessed;
    }

    MA_ASSERT(!(result == MA_AT_END && totalFramesProcessed > 0));  /* We should never be returning MA_AT_END if we read some data. */

    if (result == MA_SUCCESS && totalFramesProcessed == 0) {
        result  = MA_AT_END;
    }

    return result;
}